

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O2

void __thiscall wasm::DataFlowOpts::~DataFlowOpts(DataFlowOpts *this)

{
  ~DataFlowOpts(this);
  operator_delete(this,0x390);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }